

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Label.cpp
# Opt level: O3

void __thiscall entities::Label::Label(Label *this,Chunk *chunk,uint tileIndex,Label *rhs)

{
  Font *pFVar1;
  Uint64 UVar2;
  Uint32 UVar3;
  Color CVar4;
  Color CVar5;
  uint uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  bool bVar10;
  undefined7 uVar11;
  logger *this_00;
  LodRenderer *pLVar12;
  repr coords;
  
  Entity::Entity(&this->super_Entity,chunk,tileIndex);
  (this->super_Entity)._vptr_Entity = (_func_int **)&PTR__Label_0027a2b0;
  (this->super_Drawable)._vptr_Drawable = (_func_int **)&PTR__Label_0027a2e8;
  (this->text_).super_Drawable._vptr_Drawable = (_func_int **)&PTR__Drawable_0027a370;
  (this->text_).super_Transformable._vptr_Transformable = (_func_int **)&PTR__Transformable_0027d588
  ;
  memcpy(&(this->text_).super_Transformable.m_origin,&(rhs->text_).super_Transformable.m_origin,0xa1
        );
  (this->text_).super_Drawable._vptr_Drawable = (_func_int **)&PTR__Text_0027d7a8;
  (this->text_).super_Transformable._vptr_Transformable = (_func_int **)&PTR__Text_0027d7d0;
  sf::String::String(&(this->text_).m_string,&(rhs->text_).m_string);
  (this->text_).m_outlineThickness = (rhs->text_).m_outlineThickness;
  pFVar1 = (rhs->text_).m_font;
  uVar6 = (rhs->text_).m_characterSize;
  fVar7 = (rhs->text_).m_letterSpacingFactor;
  UVar3 = (rhs->text_).m_style;
  CVar4 = (rhs->text_).m_fillColor;
  CVar5 = (rhs->text_).m_outlineColor;
  (this->text_).m_lineSpacingFactor = (rhs->text_).m_lineSpacingFactor;
  (this->text_).m_style = UVar3;
  (this->text_).m_fillColor = CVar4;
  (this->text_).m_outlineColor = CVar5;
  (this->text_).m_font = pFVar1;
  (this->text_).m_characterSize = uVar6;
  (this->text_).m_letterSpacingFactor = fVar7;
  (this->text_).m_vertices.super_Drawable._vptr_Drawable = (_func_int **)&PTR__VertexArray_0027d828;
  std::vector<sf::Vertex,_std::allocator<sf::Vertex>_>::vector
            (&(this->text_).m_vertices.m_vertices,&(rhs->text_).m_vertices.m_vertices);
  (this->text_).m_vertices.m_primitiveType = (rhs->text_).m_vertices.m_primitiveType;
  (this->text_).m_outlineVertices.super_Drawable._vptr_Drawable =
       (_func_int **)&PTR__VertexArray_0027d828;
  std::vector<sf::Vertex,_std::allocator<sf::Vertex>_>::vector
            (&(this->text_).m_outlineVertices.m_vertices,&(rhs->text_).m_outlineVertices.m_vertices)
  ;
  (this->text_).m_outlineVertices.m_primitiveType = (rhs->text_).m_outlineVertices.m_primitiveType;
  fVar7 = (rhs->text_).m_bounds.top;
  fVar8 = (rhs->text_).m_bounds.width;
  fVar9 = (rhs->text_).m_bounds.height;
  bVar10 = (rhs->text_).m_geometryNeedUpdate;
  uVar11 = *(undefined7 *)&(rhs->text_).field_0x161;
  UVar2 = (rhs->text_).m_fontTextureId;
  (this->text_).m_bounds.left = (rhs->text_).m_bounds.left;
  (this->text_).m_bounds.top = fVar7;
  (this->text_).m_bounds.width = fVar8;
  (this->text_).m_bounds.height = fVar9;
  (this->text_).m_geometryNeedUpdate = bVar10;
  *(undefined7 *)&(this->text_).field_0x161 = uVar11;
  (this->text_).m_fontTextureId = UVar2;
  this_00 = spdlog::default_logger_raw();
  spdlog::logger::log(this_00,0.0);
  pLVar12 = Chunk::getLodRenderer(chunk);
  if (pLVar12 != (LodRenderer *)0x0) {
    pLVar12 = Chunk::getLodRenderer(chunk);
    coords = Chunk::getCoords(chunk);
    LodRenderer::addDecoration(pLVar12,coords,tileIndex,&this->super_Drawable);
  }
  return;
}

Assistant:

Label::Label(Chunk& chunk, unsigned int tileIndex, const Label& rhs) :
    Entity(chunk, tileIndex),
    text_(rhs.text_) {

    spdlog::debug("Label entity (copy) has been created.");
    if (chunk.getLodRenderer() != nullptr) {
        chunk.getLodRenderer()->addDecoration(chunk.getCoords(), tileIndex, this);
    }
}